

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O1

void __thiscall VkSpecParser::parseFeatureRequire(VkSpecParser *this,QString *versionDefine)

{
  char cVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  QList<QString> *this_00;
  QXmlStreamAttribute *attr;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  undefined1 auVar11 [16];
  QString local_80;
  QString local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QXmlStreamReader::atEnd();
  if (cVar1 == '\0') {
    do {
      QXmlStreamReader::readNext();
      iVar2 = QXmlStreamReader::tokenType();
      if (iVar2 == 5) {
        auVar11 = QXmlStreamReader::name();
        if ((auVar11._0_8_ == 7) &&
           (QVar5.m_data = auVar11._8_8_, QVar5.m_size = 7, QVar8.m_data = L"require",
           QVar8.m_size = 7, cVar1 = QtPrivate::equalStrings(QVar5,QVar8), cVar1 != '\0')) break;
      }
      iVar2 = QXmlStreamReader::tokenType();
      if (iVar2 == 4) {
        auVar11 = QXmlStreamReader::name();
        if ((auVar11._0_8_ == 7) &&
           (QVar6.m_data = auVar11._8_8_, QVar6.m_size = 7, QVar9.m_data = L"command",
           QVar9.m_size = 7, cVar1 = QtPrivate::equalStrings(QVar6,QVar9), cVar1 != '\0')) {
          QXmlStreamReader::attributes();
          iVar3 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_50);
          iVar4 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_50);
          for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
            if ((((iVar3.i)->m_name).m_string.size == 4) &&
               (QVar7.m_data = ((iVar3.i)->m_name).m_string.ptr, QVar7.m_size = 4,
               QVar10.m_data = L"name", QVar10.m_size = 4,
               cVar1 = QtPrivate::equalStrings(QVar7,QVar10), cVar1 != '\0')) {
              this_00 = QMap<QString,_QList<QString>_>::operator[]
                                  (&this->m_versionCommandMapping,versionDefine);
              QString::QString(&local_80,(QChar *)((iVar3.i)->m_value).m_string.ptr,
                               ((iVar3.i)->m_value).m_string.size);
              QString::trimmed_helper(&local_68);
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)this_00,(this_00->d).size,&local_68);
              QList<QString>::end(this_00);
              if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
        }
      }
      cVar1 = QXmlStreamReader::atEnd();
    } while (cVar1 == '\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::parseFeatureRequire(const QString &versionDefine)
{
    // <require comment="Device initialization">
    //   <command name="vkCreateInstance"/>

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("require"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("command")) {
            for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
                if (attr.name() == QStringLiteral("name"))
                    m_versionCommandMapping[versionDefine].append(attr.value().toString().trimmed());
            }
        }
    }
}